

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool background_thread_boot1(tsdn_t *tsdn)

{
  background_thread_info_t *pbVar1;
  _Bool _Var2;
  int iVar3;
  tsdn_t *tsdn_00;
  char *in_RDI;
  background_thread_info_t *info;
  uint i;
  malloc_mutex_lock_order_t in_stack_ffffffffffffff98;
  witness_rank_t in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  atomic_b_t *tsdn_01;
  uint uStack_34;
  _Bool _Stack_22;
  
  _Var2 = opt_background_thread;
  if (0xfff < opt_max_background_threads) {
    opt_max_background_threads = 4;
  }
  max_background_threads = opt_max_background_threads;
  malloc_mutex_assert_owner
            ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (malloc_mutex_t *)0x12663b);
  tsdn_01 = &background_thread_enabled_state;
  tsdn_00 = (tsdn_t *)0x0;
  uVar4 = 0;
  background_thread_enabled_state.repr = _Var2;
  _Var2 = malloc_mutex_init((malloc_mutex_t *)(ulong)in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98);
  if (_Var2) {
    _Stack_22 = true;
  }
  else {
    b0get();
    background_thread_info =
         (background_thread_info_t *)
         base_alloc((tsdn_t *)tsdn_01,(base_t *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),
                    (size_t)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (background_thread_info == (background_thread_info_t *)0x0) {
      _Stack_22 = true;
    }
    else {
      for (uStack_34 = 0; pbVar1 = background_thread_info, uStack_34 < max_background_threads;
          uStack_34 = uStack_34 + 1) {
        _Var2 = malloc_mutex_init((malloc_mutex_t *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),in_RDI
                                  ,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        if (_Var2) {
          return true;
        }
        iVar3 = func_0x0010ed10(&pbVar1[uStack_34].cond,0);
        if (iVar3 != 0) {
          return true;
        }
        malloc_mutex_lock(tsdn_00,(malloc_mutex_t *)tsdn_01);
        pbVar1[uStack_34].state = background_thread_stopped;
        background_thread_info_init
                  ((tsdn_t *)tsdn_01,
                   (background_thread_info_t *)CONCAT44(uVar4,in_stack_ffffffffffffffa8));
        malloc_mutex_unlock((tsdn_t *)tsdn_01,
                            (malloc_mutex_t *)CONCAT44(uVar4,in_stack_ffffffffffffffa8));
      }
      _Stack_22 = false;
    }
  }
  return _Stack_22;
}

Assistant:

bool
background_thread_boot1(tsdn_t *tsdn) {
#ifdef JEMALLOC_BACKGROUND_THREAD
	assert(have_background_thread);
	assert(narenas_total_get() > 0);

	if (opt_max_background_threads > MAX_BACKGROUND_THREAD_LIMIT) {
		opt_max_background_threads = DEFAULT_NUM_BACKGROUND_THREAD;
	}
	max_background_threads = opt_max_background_threads;

	background_thread_enabled_set(tsdn, opt_background_thread);
	if (malloc_mutex_init(&background_thread_lock,
	    "background_thread_global",
	    WITNESS_RANK_BACKGROUND_THREAD_GLOBAL,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	background_thread_info = (background_thread_info_t *)base_alloc(tsdn,
	    b0get(), opt_max_background_threads *
	    sizeof(background_thread_info_t), CACHELINE);
	if (background_thread_info == NULL) {
		return true;
	}

	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		/* Thread mutex is rank_inclusive because of thread0. */
		if (malloc_mutex_init(&info->mtx, "background_thread",
		    WITNESS_RANK_BACKGROUND_THREAD,
		    malloc_mutex_address_ordered)) {
			return true;
		}
		if (pthread_cond_init(&info->cond, NULL)) {
			return true;
		}
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
#endif

	return false;
}